

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O1

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>>
::~COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>>
           *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  ::~COpenGLCoreRenderTarget
            ((COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
              *)(this + lVar1),&VTT);
  operator_delete((COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
                   *)(this + lVar1),0xb0);
  return;
}

Assistant:

virtual ~COpenGLCoreRenderTarget()
	{
		if (ColorAttachment > 0 && BufferID != 0)
			Driver->irrGlDeleteFramebuffers(1, &BufferID);

		for (u32 i = 0; i < Textures.size(); ++i) {
			if (Textures[i])
				Textures[i]->drop();
		}

		if (DepthStencil)
			DepthStencil->drop();
	}